

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O2

cTValue * lj_meta_lookup(lua_State *L,cTValue *o,MMS mm)

{
  uint uVar1;
  uint *puVar2;
  cTValue *pcVar3;
  ulong uVar4;
  
  uVar1 = (o->field_2).it;
  if ((uVar1 == 0xfffffff3) || (uVar1 == 0xfffffff4)) {
    puVar2 = (uint *)((ulong)(o->u32).lo + 0x10);
  }
  else {
    if (uVar1 < 0xffff0000) {
      uVar4 = 0x23;
    }
    else if ((uVar1 & 0xffff8000) == 0xffff0000) {
      uVar4 = 0x19;
    }
    else {
      uVar4 = (ulong)(0x15 - uVar1);
    }
    puVar2 = (uint *)((ulong)(L->glref).ptr32 + 0x100 + uVar4 * 4);
  }
  if ((GCtab *)(ulong)*puVar2 == (GCtab *)0x0) {
    uVar4 = (ulong)(L->glref).ptr32;
  }
  else {
    uVar4 = (ulong)(L->glref).ptr32;
    pcVar3 = lj_tab_getstr((GCtab *)(ulong)*puVar2,
                           (GCstr *)(ulong)*(uint *)(uVar4 + 0x100 + (ulong)mm * 4));
    if (pcVar3 != (cTValue *)0x0) {
      return pcVar3;
    }
  }
  return (cTValue *)(uVar4 + 0x68);
}

Assistant:

cTValue *lj_meta_lookup(lua_State *L, cTValue *o, MMS mm)
{
  GCtab *mt;
  if (tvistab(o))
    mt = tabref(tabV(o)->metatable);
  else if (tvisudata(o))
    mt = tabref(udataV(o)->metatable);
  else
    mt = tabref(basemt_obj(G(L), o));
  if (mt) {
    cTValue *mo = lj_tab_getstr(mt, mmname_str(G(L), mm));
    if (mo)
      return mo;
  }
  return niltv(L);
}